

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

void __thiscall FStateLabels::Destroy(FStateLabels *this)

{
  FStateLabels **ppFVar1;
  long lVar2;
  
  ppFVar1 = &this->Labels[0].Children;
  for (lVar2 = 0; lVar2 < this->NumLabels; lVar2 = lVar2 + 1) {
    if (*ppFVar1 != (FStateLabels *)0x0) {
      Destroy(*ppFVar1);
      free(*ppFVar1);
      *ppFVar1 = (FStateLabels *)0x0;
    }
    ppFVar1 = ppFVar1 + 3;
  }
  return;
}

Assistant:

void FStateLabels::Destroy ()
{
	for(int i = 0; i < NumLabels; i++)
	{
		if (Labels[i].Children != NULL)
		{
			Labels[i].Children->Destroy();
			free(Labels[i].Children);	// These are malloc'd, not new'd!
			Labels[i].Children = NULL;
		}
	}
}